

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_capa_resp(connectdata *conn,int pop3code,pop3state instate)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  ulong uStack_50;
  uint mechbit;
  size_t wordlen;
  size_t llen;
  size_t len;
  char *line;
  pop3_conn *pop3c;
  Curl_easy *data;
  pop3state local_18;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  pop3c = (pop3_conn *)conn->data;
  line = (char *)&conn->proto;
  len = (size_t)(((Curl_easy *)pop3c)->state).buffer;
  local_18 = instate;
  result = pop3code;
  _instate_local = conn;
  llen = strlen((char *)len);
  if (result == CURLE_ABORTED_BY_CALLBACK) {
    if ((llen < 4) || (*(int *)len != 0x534c5453)) {
      if ((llen < 4) || (*(int *)len != 0x52455355)) {
        if ((4 < llen) && (iVar1 = memcmp((void *)len,"SASL ",5), iVar1 == 0)) {
          *(uint *)(line + 0xa8) = *(uint *)(line + 0xa8) | 4;
          len = len + 5;
          llen = llen - 5;
          while( true ) {
            while( true ) {
              bVar3 = false;
              if ((((llen != 0) && (bVar3 = true, *(char *)len != ' ')) &&
                  (bVar3 = true, *(char *)len != '\t')) && (bVar3 = true, *(char *)len != '\r')) {
                bVar3 = *(char *)len == '\n';
              }
              if (!bVar3) break;
              len = len + 1;
              llen = llen - 1;
            }
            if (llen == 0) break;
            uStack_50 = 0;
            while( true ) {
              bVar3 = false;
              if (((uStack_50 < llen) && (bVar3 = false, *(char *)(len + uStack_50) != ' ')) &&
                 ((bVar3 = false, *(char *)(len + uStack_50) != '\t' &&
                  (bVar3 = false, *(char *)(len + uStack_50) != '\r')))) {
                bVar3 = *(char *)(len + uStack_50) != '\n';
              }
              if (!bVar3) break;
              uStack_50 = uStack_50 + 1;
            }
            uVar2 = Curl_sasl_decode_mech((char *)len,uStack_50,&wordlen);
            if ((uVar2 != 0) && (wordlen == uStack_50)) {
              *(uint *)(line + 0x94) = uVar2 | *(uint *)(line + 0x94);
            }
            len = uStack_50 + len;
            llen = llen - uStack_50;
          }
        }
      }
      else {
        *(uint *)(line + 0xa8) = *(uint *)(line + 0xa8) | 1;
      }
    }
    else {
      line[0xb8] = '\x01';
    }
  }
  else if (result == CURLE_BAD_FUNCTION_ARGUMENT) {
    if ((*(int *)&pop3c[0x10].pp.endofresp == 0) || ((_instate_local->ssl[0].use & 1U) != 0)) {
      data._4_4_ = pop3_perform_authentication(_instate_local);
    }
    else if ((line[0xb8] & 1U) == 0) {
      if (*(int *)&pop3c[0x10].pp.endofresp == 1) {
        data._4_4_ = pop3_perform_authentication(_instate_local);
      }
      else {
        Curl_failf((Curl_easy *)pop3c,"STLS not supported.");
        data._4_4_ = CURLE_USE_SSL_FAILED;
      }
    }
    else {
      data._4_4_ = pop3_perform_starttls(_instate_local);
    }
  }
  else {
    *(uint *)(line + 0xa8) = *(uint *)(line + 0xa8) | 1;
    data._4_4_ = pop3_perform_authentication(_instate_local);
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_state_capa_resp(struct connectdata *conn, int pop3code,
                                     pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  const char *line = data->state.buffer;
  size_t len = strlen(line);

  (void)instate; /* no use for this yet */

  /* Do we have a untagged continuation response? */
  if(pop3code == '*') {
    /* Does the server support the STLS capability? */
    if(len >= 4 && !memcmp(line, "STLS", 4))
      pop3c->tls_supported = TRUE;

    /* Does the server support clear text authentication? */
    else if(len >= 4 && !memcmp(line, "USER", 4))
      pop3c->authtypes |= POP3_TYPE_CLEARTEXT;

    /* Does the server support SASL based authentication? */
    else if(len >= 5 && !memcmp(line, "SASL ", 5)) {
      pop3c->authtypes |= POP3_TYPE_SASL;

      /* Advance past the SASL keyword */
      line += 5;
      len -= 5;

      /* Loop through the data line */
      for(;;) {
        size_t llen;
        size_t wordlen;
        unsigned int mechbit;

        while(len &&
              (*line == ' ' || *line == '\t' ||
               *line == '\r' || *line == '\n')) {

          line++;
          len--;
        }

        if(!len)
          break;

        /* Extract the word */
        for(wordlen = 0; wordlen < len && line[wordlen] != ' ' &&
              line[wordlen] != '\t' && line[wordlen] != '\r' &&
              line[wordlen] != '\n';)
          wordlen++;

        /* Test the word for a matching authentication mechanism */
        mechbit = Curl_sasl_decode_mech(line, wordlen, &llen);
        if(mechbit && llen == wordlen)
          pop3c->sasl.authmechs |= mechbit;

        line += wordlen;
        len -= wordlen;
      }
    }
  }
  else if(pop3code == '+') {
    if(data->set.use_ssl && !conn->ssl[FIRSTSOCKET].use) {
      /* We don't have a SSL/TLS connection yet, but SSL is requested */
      if(pop3c->tls_supported)
        /* Switch to TLS connection now */
        result = pop3_perform_starttls(conn);
      else if(data->set.use_ssl == CURLUSESSL_TRY)
        /* Fallback and carry on with authentication */
        result = pop3_perform_authentication(conn);
      else {
        failf(data, "STLS not supported.");
        result = CURLE_USE_SSL_FAILED;
      }
    }
    else
      result = pop3_perform_authentication(conn);
  }
  else {
    /* Clear text is supported when CAPA isn't recognised */
    pop3c->authtypes |= POP3_TYPE_CLEARTEXT;

    result = pop3_perform_authentication(conn);
  }

  return result;
}